

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_TestMobjZ(AActor *actor,bool quick,AActor **pOnmobj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  AActor *pAVar4;
  bool bVar5;
  uint uVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  int local_230;
  int local_22c;
  TObjPtr<AActor> *local_228;
  CheckResult cres;
  FPortalGroupArray check;
  FMultiBlockThingsIterator it;
  
  if (((actor->flags).Value & 0x1000) != 0) {
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = (AActor *)0x0;
    }
    return true;
  }
  check.data.Array = (unsigned_short *)0x0;
  check.data.Most = 0;
  check.data.Count = 0;
  check.method = 1;
  check.varused = '\0';
  check.inited = false;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator(&it,&check,actor,-1.0,true);
  local_228 = &actor->target;
  pAVar8 = (AActor *)0x0;
LAB_004acfbf:
LAB_004acfd0:
  do {
    bVar5 = FMultiBlockThingsIterator::Next(&it,&cres);
    pAVar4 = cres.thing;
    if (!bVar5) goto LAB_004ad15e;
    dVar2 = (cres.thing)->radius + actor->radius;
  } while (((dVar2 <= ABS(((cres.thing)->__Pos).X - cres.Position.X)) ||
           (dVar2 <= ABS(((cres.thing)->__Pos).Y - cres.Position.Y))) ||
          ((((actor->flags2).Value | ((cres.thing)->flags2).Value) >> 0x14 & 1) != 0));
  if (((actor->flags6).Value & 2) != 0) {
    (*((cres.thing)->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_22c,cres.thing);
    (*(actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_230,actor);
    if (local_22c == local_230) goto LAB_004acfd0;
  }
  uVar6 = (pAVar4->flags).Value;
  if (((uVar6 & 0x1003) == 2) && (((uVar6 >> 0x14 & 1) == 0 || ((int)(actor->flags).Value < 0)))) {
    if (((pAVar4->flags4).Value & 0x80) == 0) {
      uVar6 = (actor->flags).Value;
      if (pAVar4 == actor || (uVar6 & 1) != 0) goto LAB_004acfd0;
    }
    else {
      if (pAVar4 == actor) goto LAB_004acfd0;
      uVar6 = (actor->flags).Value;
    }
    if (((uVar6 >> 0x10 & 1) == 0) ||
       (pAVar7 = GC::ReadBarrier<AActor>((AActor **)local_228), pAVar4 != pAVar7)) {
      dVar2 = (actor->__Pos).Z;
      dVar1 = (pAVar4->__Pos).Z;
      dVar3 = pAVar4->Height + dVar1;
      if (((dVar2 <= dVar3) && (dVar1 < dVar2 + actor->Height)) &&
         ((pAVar8 == (AActor *)0x0 || quick || ((pAVar8->__Pos).Z + pAVar8->Height <= dVar3))))
      goto LAB_004ad141;
    }
  }
  goto LAB_004acfd0;
LAB_004ad141:
  pAVar8 = pAVar4;
  if (quick) {
LAB_004ad15e:
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = pAVar8;
    }
    TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
              (&it.blockIterator.DynHash);
    TArray<unsigned_short,_unsigned_short>::~TArray(&check.data);
    return pAVar8 == (AActor *)0x0;
  }
  goto LAB_004acfbf;
}

Assistant:

bool P_TestMobjZ(AActor *actor, bool quick, AActor **pOnmobj)
{
	AActor *onmobj = NULL;
	if (actor->flags & MF_NOCLIP)
	{
		if (pOnmobj) *pOnmobj = NULL;
		return true;
	}

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, actor, -1, true);
	FMultiBlockThingsIterator::CheckResult cres;

	while (it.Next(&cres))
	{
		AActor *thing = cres.thing;

		double blockdist = thing->radius + actor->radius;
		if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		{
			continue;
		}
		if ((actor->flags2 | thing->flags2) & MF2_THRUACTORS)
		{
			continue;
		}
		if ((actor->flags6 & MF6_THRUSPECIES) && (thing->GetSpecies() == actor->GetSpecies()))
		{
			continue;
		}
		if (!(thing->flags & MF_SOLID))
		{ // Can't hit thing
			continue;
		}
		if (thing->flags & (MF_SPECIAL | MF_NOCLIP))
		{ // [RH] Specials and noclippers don't block moves
			continue;
		}
		if (thing->flags & (MF_CORPSE))
		{ // Corpses need a few more checks
			if (!(actor->flags & MF_ICECORPSE))
				continue;
		}
		if (!(thing->flags4 & MF4_ACTLIKEBRIDGE) && (actor->flags & MF_SPECIAL))
		{ // [RH] Only bridges block pickup items
			continue;
		}
		if (thing == actor)
		{ // Don't clip against self
			continue;
		}
		if ((actor->flags & MF_MISSILE) && (thing == actor->target))
		{ // Don't clip against whoever shot the missile.
			continue;
		}
		if (actor->Z() > thing->Top())
		{ // over thing
			continue;
		}
		else if (actor->Top() <= thing->Z())
		{ // under thing
			continue;
		}
		else if (!quick && onmobj != NULL && thing->Top() < onmobj->Top())
		{ // something higher is in the way
			continue;
		}
		onmobj = thing;
		if (quick) break;
	}

	if (pOnmobj) *pOnmobj = onmobj;
	return onmobj == NULL;
}